

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void blend_a64_mask_sy_avx2
               (uint8_t *dst,uint32_t dst_stride,uint8_t *src0,uint32_t src0_stride,uint8_t *src1,
               uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int w,int h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined4 in_ECX;
  undefined8 in_RDX;
  uint in_ESI;
  void *in_RDI;
  long in_R8;
  uint in_R9D;
  __m128i *palVar4;
  undefined1 auVar5 [16];
  uint8_t *puVar7;
  undefined1 auVar6 [16];
  __m128i alVar8;
  __m128i v;
  void *in_stack_00000008;
  uint in_stack_00000010;
  uint32_t in_stack_00000018;
  int in_stack_00000020;
  __m128i v_res_b_1;
  __m128i v_m1_b_1;
  __m128i v_m0_b_1;
  __m128i v_rb_b_1;
  __m128i v_ra_b_1;
  __m128i v_res_b;
  __m128i v_m1_b;
  __m128i v_m0_b;
  __m128i v_rb_b;
  __m128i v_ra_b;
  __m128i v_maxval_b;
  __m128i _r;
  undefined4 in_stack_fffffffffffffe04;
  int in_stack_fffffffffffffe18;
  undefined8 local_1d8;
  undefined8 uStack_1d0;
  undefined1 in_stack_fffffffffffffe48 [16];
  __m128i *in_stack_fffffffffffffe58;
  uint8_t *in_stack_fffffffffffffe60;
  uint8_t *in_stack_fffffffffffffe68;
  undefined1 in_stack_fffffffffffffe78 [16];
  undefined1 in_stack_fffffffffffffe88 [16];
  undefined1 in_stack_fffffffffffffe98 [16];
  long lVar9;
  undefined4 in_stack_ffffffffffffff00;
  undefined4 in_stack_ffffffffffffff10;
  undefined6 in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff56;
  
  auVar1 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar1 = vpinsrw_avx(auVar1,0x200,2);
  auVar1 = vpinsrw_avx(auVar1,0x200,3);
  auVar1 = vpinsrw_avx(auVar1,0x200,4);
  auVar1 = vpinsrw_avx(auVar1,0x200,5);
  auVar1 = vpinsrw_avx(auVar1,0x200,6);
  vpinsrw_avx(auVar1,0x200,7);
  auVar1 = vpinsrb_avx(ZEXT116(0x40),0x40,1);
  auVar1 = vpinsrb_avx(auVar1,0x40,2);
  auVar1 = vpinsrb_avx(auVar1,0x40,3);
  auVar1 = vpinsrb_avx(auVar1,0x40,4);
  auVar1 = vpinsrb_avx(auVar1,0x40,5);
  auVar1 = vpinsrb_avx(auVar1,0x40,6);
  auVar1 = vpinsrb_avx(auVar1,0x40,7);
  auVar1 = vpinsrb_avx(auVar1,0x40,8);
  auVar1 = vpinsrb_avx(auVar1,0x40,9);
  auVar1 = vpinsrb_avx(auVar1,0x40,10);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xb);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xc);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xd);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xe);
  auVar1 = vpinsrb_avx(auVar1,0x40,0xf);
  local_1d8 = auVar1._0_8_;
  uStack_1d0 = auVar1._8_8_;
  if (in_stack_00000018 == 4) {
    do {
      xx_loadl_32(in_stack_00000008);
      palVar4 = local_1d8;
      puVar7 = uStack_1d0;
      xx_loadl_32((void *)((long)in_stack_00000008 + (ulong)in_stack_00000010));
      auVar6._8_8_ = uStack_1d0;
      auVar6._0_8_ = local_1d8;
      auVar5._8_8_ = puVar7;
      auVar5._0_8_ = palVar4;
      auVar5 = vpavgb_avx(auVar6,auVar5);
      auVar5 = vpsubb_avx(auVar1,auVar5);
      lVar9 = in_R8;
      alVar8 = blend_4_u8(in_stack_fffffffffffffe68,in_stack_fffffffffffffe60,
                          in_stack_fffffffffffffe58,in_stack_fffffffffffffe48._8_8_,
                          in_stack_fffffffffffffe48._0_8_);
      local_1d8 = auVar5._0_8_;
      uStack_1d0 = auVar5._8_8_;
      alVar8[0] = in_R8;
      xx_storel_32(in_RDI,alVar8);
      in_RDI = (void *)((long)in_RDI + (ulong)in_ESI);
      in_R8 = lVar9 + (ulong)in_R9D;
      in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 << 1));
      in_stack_00000020 = in_stack_00000020 + -1;
    } while (in_stack_00000020 != 0);
  }
  else if (in_stack_00000018 == 8) {
    do {
      xx_loadl_64(in_stack_00000008);
      puVar7 = uStack_1d0;
      palVar4 = local_1d8;
      xx_loadl_64((void *)((long)in_stack_00000008 + (ulong)in_stack_00000010));
      auVar3._8_8_ = uStack_1d0;
      auVar3._0_8_ = palVar4;
      auVar2._8_8_ = puVar7;
      auVar2._0_8_ = local_1d8;
      auVar5 = vpavgb_avx(auVar3,auVar2);
      auVar6 = vpsubb_avx(auVar1,auVar5);
      lVar9 = in_R8;
      alVar8 = blend_8_u8((uint8_t *)palVar4,puVar7,local_1d8,auVar5._8_8_,auVar5._0_8_);
      v[1] = alVar8[1];
      local_1d8 = auVar6._0_8_;
      uStack_1d0 = auVar6._8_8_;
      v[0] = in_R8;
      xx_storel_64(in_RDI,v);
      in_RDI = (void *)((long)in_RDI + (ulong)in_ESI);
      in_R8 = lVar9 + (ulong)in_R9D;
      in_stack_00000008 = (void *)((long)in_stack_00000008 + (ulong)(in_stack_00000010 << 1));
      in_stack_00000020 = in_stack_00000020 + -1;
    } while (in_stack_00000020 != 0);
  }
  else if (in_stack_00000018 == 0x10) {
    blend_a64_mask_sy_w16_avx2
              (in_stack_fffffffffffffe98._8_8_,in_stack_fffffffffffffe98._4_4_,
               in_stack_fffffffffffffe88._8_8_,in_stack_fffffffffffffe88._4_4_,
               in_stack_fffffffffffffe78._8_8_,in_stack_fffffffffffffe78._4_4_,
               (uint8_t *)CONCAT17(0x40,CONCAT16(in_stack_ffffffffffffff56,0x20002000200)),
               auVar1._0_4_,auVar1._8_4_);
  }
  else {
    blend_a64_mask_sy_w32n_avx2
              ((uint8_t *)CONCAT26(0x200,in_stack_ffffffffffffff20),
               (uint32_t)((ulong)in_RDI >> 0x20),
               (uint8_t *)CONCAT44(in_ESI,in_stack_ffffffffffffff10),
               (uint32_t)((ulong)in_RDX >> 0x20),
               (uint8_t *)CONCAT44(in_ECX,in_stack_ffffffffffffff00),
               (uint32_t)((ulong)in_R8 >> 0x20),
               (uint8_t *)CONCAT44(in_stack_fffffffffffffe04,in_stack_00000010),in_stack_00000018,
               in_stack_00000020,in_stack_fffffffffffffe18);
  }
  return;
}

Assistant:

static inline void blend_a64_mask_sy_avx2(
    uint8_t *dst, uint32_t dst_stride, const uint8_t *src0,
    uint32_t src0_stride, const uint8_t *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int w, int h) {
  const __m128i _r = _mm_set1_epi16(1 << (15 - AOM_BLEND_A64_ROUND_BITS));
  const __m128i v_maxval_b = _mm_set1_epi8(AOM_BLEND_A64_MAX_ALPHA);
  switch (w) {
    case 4:
      do {
        const __m128i v_ra_b = xx_loadl_32(mask);
        const __m128i v_rb_b = xx_loadl_32(mask + mask_stride);
        const __m128i v_m0_b = _mm_avg_epu8(v_ra_b, v_rb_b);
        const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);
        const __m128i v_res_b = blend_4_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

        xx_storel_32(dst, v_res_b);

        dst += dst_stride;
        src0 += src0_stride;
        src1 += src1_stride;
        mask += 2 * mask_stride;
      } while (--h);
      break;
    case 8:
      do {
        const __m128i v_ra_b = xx_loadl_64(mask);
        const __m128i v_rb_b = xx_loadl_64(mask + mask_stride);
        const __m128i v_m0_b = _mm_avg_epu8(v_ra_b, v_rb_b);
        const __m128i v_m1_b = _mm_sub_epi8(v_maxval_b, v_m0_b);
        const __m128i v_res_b = blend_8_u8(src0, src1, &v_m0_b, &v_m1_b, &_r);

        xx_storel_64(dst, v_res_b);

        dst += dst_stride;
        src0 += src0_stride;
        src1 += src1_stride;
        mask += 2 * mask_stride;
      } while (--h);
      break;
    case 16:
      blend_a64_mask_sy_w16_avx2(dst, dst_stride, src0, src0_stride, src1,
                                 src1_stride, mask, mask_stride, h);
      break;
    default:
      blend_a64_mask_sy_w32n_avx2(dst, dst_stride, src0, src0_stride, src1,
                                  src1_stride, mask, mask_stride, w, h);
  }
}